

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WaveletTree.h
# Opt level: O2

void __thiscall bwtil::WaveletTree::loadFromFile(WaveletTree *this,FILE *fp)

{
  long lVar1;
  ulint i;
  ulong uVar2;
  allocator_type local_41;
  vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_> local_40;
  
  fread(this,8,1,(FILE *)fp);
  fread(&this->sigma,4,1,(FILE *)fp);
  fread(&this->log_sigma,4,1,(FILE *)fp);
  fread(&this->number_of_nodes,8,1,(FILE *)fp);
  std::vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>::vector
            (&local_40,this->number_of_nodes,&local_41);
  std::vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>::_M_move_assign
            (&this->nodes,&local_40);
  std::vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>::~vector
            (&local_40);
  lVar1 = 0;
  for (uVar2 = 0; uVar2 < this->number_of_nodes; uVar2 = uVar2 + 1) {
    succinct_bitvector::loadFromFile
              ((succinct_bitvector *)
               ((long)&((this->nodes).
                        super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>
                        ._M_impl.super__Vector_impl_data._M_start)->n + lVar1),fp);
    lVar1 = lVar1 + 0x60;
  }
  return;
}

Assistant:

void loadFromFile(FILE *fp){

		ulint numBytes;

		numBytes = fread(&n, sizeof(ulint), 1, fp);
		assert(numBytes>0);
		numBytes = fread(&sigma, sizeof(uint), 1, fp);
		assert(numBytes>0);
		numBytes = fread(&log_sigma, sizeof(uint), 1, fp);
		assert(numBytes>0);
		numBytes = fread(&number_of_nodes, sizeof(ulint), 1, fp);
		assert(numBytes>0);

		nodes = vector<succinct_bitvector>(number_of_nodes);

		for(ulint i=0;i<number_of_nodes;i++)
			nodes[i].loadFromFile(fp);

		numBytes++;//avoids "variable not used" warning

	}